

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-test.c++
# Opt level: O2

void __thiscall kj::anon_unknown_0::TestCase583::run(TestCase583 *this)

{
  PathPtr fromPath;
  PathPtr toPath;
  Directory *pDVar1;
  Directory *this_00;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  StringPtr name;
  PathPtr path;
  StringPtr text;
  StringPtr name_00;
  StringPtr name_01;
  StringPtr name_02;
  PathPtr path_00;
  StringPtr name_03;
  PathPtr path_01;
  StringPtr text_00;
  StringPtr name_04;
  PathPtr path_02;
  StringPtr name_05;
  StringPtr text_01;
  StringPtr name_06;
  PathPtr path_03;
  StringPtr name_07;
  PathPtr path_04;
  Own<kj::Directory::Replacer<kj::File>_> replacer;
  Array<kj::String> local_c8;
  Own<const_kj::ReadableFile> local_b0;
  Own<kj::Directory> src;
  Own<kj::Directory> dst;
  StringPtr local_80;
  TempDir tempDirDst;
  TempDir tempDirSrc;
  
  TempDir::TempDir(&tempDirSrc);
  TempDir::TempDir(&tempDirDst);
  TempDir::get((TempDir *)&src);
  TempDir::get((TempDir *)&dst);
  pDVar1 = src.ptr;
  name.content.size_ = 4;
  name.content.ptr = "foo";
  Path::Path((Path *)&local_c8,name);
  path.parts.size_ = (size_t)local_c8.ptr;
  path.parts.ptr = (String *)pDVar1;
  Directory::openFile((Directory *)&replacer,path,(WriteMode)local_c8.size_);
  text.content.size_ = 7;
  text.content.ptr = "foobar";
  File::writeAll((File *)replacer.ptr,text);
  Own<const_kj::File>::dispose((Own<const_kj::File> *)&replacer);
  Array<kj::String>::~Array(&local_c8);
  this_00 = dst.ptr;
  name_00.content.size_ = 5;
  name_00.content.ptr = "link";
  Path::Path((Path *)&local_c8,name_00);
  pDVar1 = src.ptr;
  toPath.parts.size_ = local_c8.size_;
  toPath.parts.ptr = local_c8.ptr;
  name_01.content.size_ = 4;
  name_01.content.ptr = "foo";
  Path::Path((Path *)&replacer,name_01);
  fromPath.parts.size_ = (size_t)replacer.ptr;
  fromPath.parts.ptr = (String *)replacer.disposer;
  Directory::transfer(this_00,toPath,CREATE,pDVar1,fromPath,LINK);
  Array<kj::String>::~Array((Array<kj::String> *)&replacer);
  Array<kj::String>::~Array(&local_c8);
  pDVar1 = dst.ptr;
  name_02.content.size_ = 5;
  name_02.content.ptr = "link";
  Path::Path((Path *)&replacer,name_02);
  path_00.parts.size_ = (size_t)replacer.disposer;
  path_00.parts.ptr = (String *)pDVar1;
  ReadableDirectory::openFile((ReadableDirectory *)&local_b0,path_00);
  ReadableFile::readAllText((String *)&local_c8,local_b0.ptr);
  local_80.content.ptr = "foobar";
  local_80.content.size_ = 7;
  bVar2 = String::operator==((String *)&local_c8,&local_80);
  Array<char>::~Array((Array<char> *)&local_c8);
  Own<const_kj::ReadableFile>::dispose(&local_b0);
  Array<kj::String>::~Array((Array<kj::String> *)&replacer);
  if (!bVar2 && _::Debug::minSeverity < 3) {
    _::Debug::log<char_const(&)[72]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-disk-test.c++"
               ,0x253,ERROR,
               "\"failed: expected \" \"dst->openFile(Path(\\\"link\\\"))->readAllText() == \\\"foobar\\\"\""
               ,(char (*) [72])
                "failed: expected dst->openFile(Path(\"link\"))->readAllText() == \"foobar\"");
  }
  pDVar1 = src.ptr;
  name_03.content.size_ = 4;
  name_03.content.ptr = "foo";
  Path::Path((Path *)&local_c8,name_03);
  path_01.parts.size_ = (size_t)local_c8.ptr;
  path_01.parts.ptr = (String *)pDVar1;
  Directory::openFile((Directory *)&replacer,path_01,(WriteMode)local_c8.size_);
  text_00.content.size_ = 7;
  text_00.content.ptr = "bazqux";
  File::writeAll((File *)replacer.ptr,text_00);
  Own<const_kj::File>::dispose((Own<const_kj::File> *)&replacer);
  Array<kj::String>::~Array(&local_c8);
  pDVar1 = dst.ptr;
  name_04.content.size_ = 5;
  name_04.content.ptr = "link";
  Path::Path((Path *)&replacer,name_04);
  path_02.parts.size_ = (size_t)replacer.disposer;
  path_02.parts.ptr = (String *)pDVar1;
  ReadableDirectory::openFile((ReadableDirectory *)&local_b0,path_02);
  ReadableFile::readAllText((String *)&local_c8,local_b0.ptr);
  local_80.content.ptr = "bazqux";
  local_80.content.size_ = 7;
  bVar2 = String::operator==((String *)&local_c8,&local_80);
  Array<char>::~Array((Array<char> *)&local_c8);
  Own<const_kj::ReadableFile>::dispose(&local_b0);
  Array<kj::String>::~Array((Array<kj::String> *)&replacer);
  if (!bVar2 && _::Debug::minSeverity < 3) {
    _::Debug::log<char_const(&)[72]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-disk-test.c++"
               ,599,ERROR,
               "\"failed: expected \" \"dst->openFile(Path(\\\"link\\\"))->readAllText() == \\\"bazqux\\\"\""
               ,(char (*) [72])
                "failed: expected dst->openFile(Path(\"link\"))->readAllText() == \"bazqux\"");
  }
  pDVar1 = src.ptr;
  name_05.content.size_ = 4;
  name_05.content.ptr = "foo";
  Path::Path((Path *)&local_c8,name_05);
  (*(pDVar1->super_ReadableDirectory).super_FsNode._vptr_FsNode[0xe])
            (&replacer,pDVar1,local_c8.ptr,local_c8.size_,2);
  Array<kj::String>::~Array(&local_c8);
  iVar3 = (**(replacer.ptr)->_vptr_Replacer)();
  text_01.content.size_ = 6;
  text_01.content.ptr = "corge";
  File::writeAll((File *)CONCAT44(extraout_var,iVar3),text_01);
  Directory::Replacer<kj::File>::commit(replacer.ptr);
  Own<kj::Directory::Replacer<kj::File>_>::dispose(&replacer);
  name_06.content.size_ = 4;
  name_06.content.ptr = "foo";
  Path::Path((Path *)&replacer,name_06);
  path_03.parts.size_ = (size_t)replacer.disposer;
  path_03.parts.ptr = (String *)src.ptr;
  ReadableDirectory::openFile((ReadableDirectory *)&local_b0,path_03);
  ReadableFile::readAllText((String *)&local_c8,local_b0.ptr);
  local_80.content.ptr = "corge";
  local_80.content.size_ = 6;
  bVar2 = String::operator==((String *)&local_c8,&local_80);
  Array<char>::~Array((Array<char> *)&local_c8);
  Own<const_kj::ReadableFile>::dispose(&local_b0);
  Array<kj::String>::~Array((Array<kj::String> *)&replacer);
  if (!bVar2 && _::Debug::minSeverity < 3) {
    _::Debug::log<char_const(&)[70]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-disk-test.c++"
               ,0x25f,ERROR,
               "\"failed: expected \" \"src->openFile(Path(\\\"foo\\\"))->readAllText() == \\\"corge\\\"\""
               ,(char (*) [70])
                "failed: expected src->openFile(Path(\"foo\"))->readAllText() == \"corge\"");
  }
  name_07.content.size_ = 5;
  name_07.content.ptr = "link";
  Path::Path((Path *)&replacer,name_07);
  path_04.parts.size_ = (size_t)replacer.disposer;
  path_04.parts.ptr = (String *)dst.ptr;
  ReadableDirectory::openFile((ReadableDirectory *)&local_b0,path_04);
  ReadableFile::readAllText((String *)&local_c8,local_b0.ptr);
  local_80.content.ptr = "bazqux";
  local_80.content.size_ = 7;
  bVar2 = String::operator==((String *)&local_c8,&local_80);
  Array<char>::~Array((Array<char> *)&local_c8);
  Own<const_kj::ReadableFile>::dispose(&local_b0);
  Array<kj::String>::~Array((Array<kj::String> *)&replacer);
  if (!bVar2 && _::Debug::minSeverity < 3) {
    _::Debug::log<char_const(&)[72]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-disk-test.c++"
               ,0x260,ERROR,
               "\"failed: expected \" \"dst->openFile(Path(\\\"link\\\"))->readAllText() == \\\"bazqux\\\"\""
               ,(char (*) [72])
                "failed: expected dst->openFile(Path(\"link\"))->readAllText() == \"bazqux\"");
  }
  Own<kj::Directory>::dispose(&dst);
  Own<kj::Directory>::dispose(&src);
  TempDir::~TempDir(&tempDirDst);
  TempDir::~TempDir(&tempDirSrc);
  return;
}

Assistant:

TEST(Async, Canceler) {
  EventLoop loop;
  WaitScope waitScope(loop);
  Canceler canceler;

  auto never = canceler.wrap(kj::Promise<void>(kj::NEVER_DONE));
  auto now = canceler.wrap(kj::Promise<void>(kj::READY_NOW));
  auto neverI = canceler.wrap(kj::Promise<void>(kj::NEVER_DONE).then([]() { return 123u; }));
  auto nowI = canceler.wrap(kj::Promise<uint>(123u));

  KJ_EXPECT(!never.poll(waitScope));
  KJ_EXPECT(now.poll(waitScope));
  KJ_EXPECT(!neverI.poll(waitScope));
  KJ_EXPECT(nowI.poll(waitScope));

  canceler.cancel("foobar");

  KJ_EXPECT_THROW_RECOVERABLE_MESSAGE("foobar", never.wait(waitScope));
  now.wait(waitScope);
  KJ_EXPECT_THROW_MESSAGE("foobar", neverI.wait(waitScope));
  KJ_EXPECT(nowI.wait(waitScope) == 123u);
}